

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  ImGuiContext *pIVar1;
  ImPoolIdx i;
  ImGuiTableColumn *pIVar2;
  float *pfVar3;
  ImGuiTable *in_RDI;
  int n;
  ImGuiContext *g;
  ImDrawListSplitter *in_stack_ffffffffffffffe0;
  ImVector<float> *this;
  int local_14;
  
  pIVar1 = GImGui;
  ImDrawListSplitter::ClearFreeMemory(in_stack_ffffffffffffffe0);
  ImVector<ImGuiTableColumnSortSpecs>::clear
            ((ImVector<ImGuiTableColumnSortSpecs> *)in_stack_ffffffffffffffe0);
  (in_RDI->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
  in_RDI->IsSortSpecsDirty = true;
  ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1b3897);
  in_RDI->MemoryCompacted = true;
  for (local_14 = 0; local_14 < in_RDI->ColumnsCount; local_14 = local_14 + 1) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&in_RDI->Columns,local_14);
    pIVar2->NameOffset = -1;
  }
  this = &pIVar1->TablesLastTimeActive;
  i = ImPool<ImGuiTable>::GetIndex(&pIVar1->Tables,in_RDI);
  pfVar3 = ImVector<float>::operator[](this,i);
  *pfVar3 = -1.0;
  return;
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->DrawSplitter.ClearFreeMemory();
    table->SortSpecsMulti.clear();
    table->SortSpecs.Specs = NULL;
    table->IsSortSpecsDirty = true;
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}